

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execDivuMusashi<(moira::Core)0,(moira::Instr)55,(moira::Mode)10,2>
          (Moira *this,u16 opcode,bool *divByZero)

{
  u32 in_EAX;
  u32 uVar1;
  ulong uVar2;
  u32 divisor;
  u32 ea;
  
  divisor = in_EAX;
  readOp<(moira::Core)0,(moira::Mode)10,2,0ull>(this,opcode & 7,&ea,&divisor);
  if (divisor == 0) {
    execException<(moira::Core)0>(this,DIVIDE_BY_ZERO,0);
    *divByZero = true;
  }
  else {
    uVar2 = (ulong)(opcode >> 9 & 7);
    uVar1 = divuMusashi<(moira::Core)0>
                      (this,*(u32 *)((long)&(this->reg).field_3 + uVar2 * 4),divisor);
    *(u32 *)((long)&(this->reg).field_3 + uVar2 * 4) = uVar1;
    prefetch<(moira::Core)0,4ull>(this);
  }
  return;
}

Assistant:

void
Moira::execDivuMusashi(u16 opcode, bool *divByZero)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    [[maybe_unused]] i64 c = clock;
    u32 ea, divisor, result;
    readOp<C, M, Word>(src, &ea, &divisor);

    // Check for division by zero
    if (divisor == 0) {
        if constexpr (C == Core::C68000) {
            SYNC(8 - (int)(clock - c));
        } else {
            SYNC(10 - (int)(clock - c));
        }
        execException<C>(M68kException::DIVIDE_BY_ZERO);
        *divByZero = true;
        return;
    }

    u32 dividend = readD(dst);
    result = divuMusashi<C>(dividend, divisor);

    SYNC_68000(136);
    SYNC_68010(104);

    writeD(dst, result);
    prefetch<C, POLL>();
}